

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical.cc
# Opt level: O1

bool __thiscall lexical::analyse_string(lexical *this,iterator *it,Meta *m)

{
  char *pcVar1;
  Token t;
  string buf;
  
  if (it->_M_current != (m->end)._M_current) {
    do {
      pcVar1 = it->_M_current;
      it->_M_current = pcVar1 + 1;
    } while (pcVar1 + 1 != (m->end)._M_current);
  }
  return false;
}

Assistant:

bool lexical::analyse_string(string::iterator &it, const Meta &m) {
    int state = 0;
    string buf;

    //判断是否是需要转义的字符
    int countU = 0;
    int countO = 0;
    while (it != m.end) {
        switch (state) {
            case 0: {
                state = 1;
                break;
            }
                //分析普通字符
            case 1: {
                if (*it == '\\') {
                    state = 2;
                    buf.push_back(*it);
                } else if (*it == '"')
                    state = 5;
                else
                    buf.push_back(*it);

                break;
            }
                //分析普通转义字符
            case 2: {
                buf.push_back(*it);
                if (table.in_escape_chars(*it)) {
                    state = 1;
                } else if (*it == 'u') {
                    state = 3;
                } else if (sutil::is_octal(*it)) {
                    --it;
                    buf.pop_back();
                    state = 4;
                } else {
                    error(it, m, "非法的转义字符");
                    return false;
                }
                break;
            }
                //分析 \uFFFF
            case 3: {
                if (countU++ < 4) {
                    if (isxdigit(*it))buf.push_back(*it);
                    else {
                        error(it, m, "unicode表示法需要4位16进制数");
                        return false;
                    }
                } else {
                    --it;
                    countU = 0;
                    state = 1;
                }
                break;
            }
                // 分析\八进制*3
            case 4: {
                auto init = [&it, &countO, &state]() -> void {
                    --it;
                    countO = 0;
                    state = 1;
                };
                if (countO++ < 3) {
                    if (sutil::is_octal(*it)) {
                        ++countO;
                        buf.push_back(*it);
                    } else if (countO != 0) {
                        init();
                    } else {
                        error(it, m, "八进制字符需要1-3位八进制数");
                        return false;
                    }
                } else
                    init();

                break;
            }
            case 5: {
                Token t(m.line, m.column, Token::STRING, buf);
                tokens.push_back(t);
                symbols.insert(Symbol(t.type, t.name));
                return true;
            }
        }
        ++it;
    }
    return false;
}